

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_enumerator.cpp
# Opt level: O1

void __thiscall Clasp::CBConsequences::CBConsequences(CBConsequences *this,Type type,Algo algo)

{
  Algo AVar1;
  
  Enumerator::Enumerator(&this->super_Enumerator);
  (this->super_Enumerator)._vptr_Enumerator = (_func_int **)&PTR__CBConsequences_001eb470;
  (this->cons_).ebo_.buf = (pointer)0x0;
  (this->cons_).ebo_.size = 0;
  (this->cons_).ebo_.cap = 0;
  this->shared_ = (SharedConstraint *)0x0;
  this->type_ = type;
  AVar1 = Default;
  if (type == Cautious) {
    AVar1 = algo;
  }
  this->algo_ = AVar1;
  return;
}

Assistant:

CBConsequences::CBConsequences(Type type, Algo algo)
	: Enumerator()
	, shared_(0)
	, type_(type)
	, algo_(algo) {
	if (type_ != Cautious) { algo_ = Default; }
}